

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_lights.cxx
# Opt level: O0

void __thiscall read_light_v13::operator()(read_light_v13 *this,light_data **_light,xr_reader *r)

{
  uint32_t uVar1;
  light_data *plVar2;
  light_data *light;
  xr_reader *r_local;
  light_data **_light_local;
  read_light_v13 *this_local;
  
  plVar2 = (light_data *)operator_new(0x6c);
  *_light = plVar2;
  uVar1 = xray_re::xr_reader::r_u32(r);
  plVar2->controller_id = uVar1;
  xray_re::d3d_light::load(&plVar2->d3d_params,r);
  return;
}

Assistant:

void operator()(light_data*& _light, xr_reader& r) const {
	light_data* light = new light_data;
	_light = light;
	light->controller_id = r.r_u32();
	light->d3d_params.load(r);
}